

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void Assimp::Write(JSONWriter *out,aiLight *ai,bool is_elem)

{
  allocator<char> local_31;
  string local_30;
  
  JSONWriter::StartObj(out,is_elem);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"name",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<aiString>(out,&ai->mName);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"type",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<aiLightSourceType>(out,&ai->mType);
  if ((ai->mType == aiLightSource_SPOT) || (ai->mType == aiLightSource_UNDEFINED)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"angleinnercone",&local_31);
    JSONWriter::Key(out,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    JSONWriter::SimpleValue<float>(out,&ai->mAngleInnerCone);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"angleoutercone",&local_31);
    JSONWriter::Key(out,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    JSONWriter::SimpleValue<float>(out,&ai->mAngleOuterCone);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"attenuationconstant",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<float>(out,&ai->mAttenuationConstant);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"attenuationlinear",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<float>(out,&ai->mAttenuationLinear);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"attenuationquadratic",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<float>(out,&ai->mAttenuationQuadratic);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"diffusecolor",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  Write(out,&ai->mColorDiffuse,false);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"specularcolor",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  Write(out,&ai->mColorSpecular,false);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"ambientcolor",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  Write(out,&ai->mColorAmbient,false);
  if (ai->mType != aiLightSource_POINT) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"direction",&local_31);
    JSONWriter::Key(out,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    Write(out,&ai->mDirection,false);
    if (ai->mType == aiLightSource_DIRECTIONAL) goto LAB_00394e86;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"position",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  Write(out,&ai->mPosition,false);
LAB_00394e86:
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiLight& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mName);

    out.Key("type");
    out.SimpleValue(ai.mType);

    if (ai.mType == aiLightSource_SPOT || ai.mType == aiLightSource_UNDEFINED) {
        out.Key("angleinnercone");
        out.SimpleValue(ai.mAngleInnerCone);

        out.Key("angleoutercone");
        out.SimpleValue(ai.mAngleOuterCone);
    }

    out.Key("attenuationconstant");
    out.SimpleValue(ai.mAttenuationConstant);

    out.Key("attenuationlinear");
    out.SimpleValue(ai.mAttenuationLinear);

    out.Key("attenuationquadratic");
    out.SimpleValue(ai.mAttenuationQuadratic);

    out.Key("diffusecolor");
    Write(out, ai.mColorDiffuse, false);

    out.Key("specularcolor");
    Write(out, ai.mColorSpecular, false);

    out.Key("ambientcolor");
    Write(out, ai.mColorAmbient, false);

    if (ai.mType != aiLightSource_POINT) {
        out.Key("direction");
        Write(out, ai.mDirection, false);

    }

    if (ai.mType != aiLightSource_DIRECTIONAL) {
        out.Key("position");
        Write(out, ai.mPosition, false);
    }

    out.EndObj();
}